

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O3

int get_versionless(FileName *varray,char *file,char *dir)

{
  FileName *pFVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  
  uVar4 = varray->version_no;
  if (uVar4 != 0xffffffff) {
    while (uVar4 != 0xffffffff) {
      pcVar2 = dir;
      pcVar5 = dir;
      if (uVar4 == 0) {
        for (; (pcVar6 = pcVar5, *pcVar5 == '/' || (pcVar6 = pcVar2, *pcVar5 != '\0'));
            pcVar5 = pcVar5 + 1) {
          pcVar2 = pcVar6;
        }
        if (pcVar5 + -1 == pcVar2) {
          if (pcVar2 == dir) {
            file[0] = '/';
            file[1] = '\0';
          }
          else {
            strcpy(file,dir);
          }
        }
        else {
          strcpy(file,dir);
          sVar3 = strlen(file);
          (file + sVar3)[0] = '/';
          (file + sVar3)[1] = '\0';
        }
        strcat(file,varray->name);
        return 1;
      }
      pFVar1 = varray + 1;
      varray = varray + 1;
      uVar4 = pFVar1->version_no;
    }
  }
  return 0;
}

Assistant:

static int get_versionless(FileName *varray, char *file, char *dir)
{
#ifdef DOS
  return (0);
#endif /* DOS */
  if (NoFileP(varray)) return (0);

  while (varray->version_no != LASTVERSIONARRAY) {
    if (varray->version_no == 0) {
      ConcDirAndName(dir, varray->name, file);
      return (1);
    } else
      varray++;
  }
  return (0);
}